

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O1

QSize __thiscall QtMWidgets::TextLabel::minimumSizeHint(TextLabel *this)

{
  int iVar1;
  QSize QVar2;
  int iVar3;
  double in_XMM1_Qa;
  double dVar4;
  undefined1 auVar5 [16];
  QTextDocument doc;
  QArrayData *local_58 [2];
  long local_48;
  QString local_40;
  double local_28;
  
  QStaticText::text();
  if (local_58[0] != (QArrayData *)0x0) {
    LOCK();
    (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58[0],2,8);
    }
  }
  if (local_48 == 0) {
    iVar3 = QFrame::frameWidth();
    iVar3 = iVar3 * 2;
    iVar1 = QFrame::frameWidth();
    iVar1 = iVar1 * 2;
  }
  else {
    auVar5 = QWidget::contentsMargins();
    QTextDocument::QTextDocument((QTextDocument *)&local_40,(QObject *)0x0);
    QStaticText::text();
    QTextDocument::setHtml(&local_40);
    if (local_58[0] != (QArrayData *)0x0) {
      LOCK();
      (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58[0],2,8);
      }
    }
    QStaticText::textOption();
    QTextDocument::setDefaultTextOption((QTextOption *)&local_40);
    QTextOption::~QTextOption((QTextOption *)local_58);
    QFontMetrics::QFontMetrics
              ((QFontMetrics *)local_58,(QFont *)(*(long *)&this->field_0x20 + 0x38));
    iVar1 = QFontMetrics::averageCharWidth();
    QTextDocument::setTextWidth((double)(iVar1 * 10));
    QFontMetrics::~QFontMetrics((QFontMetrics *)local_58);
    local_40.d.size = QTextDocument::size();
    local_28 = in_XMM1_Qa;
    iVar1 = QFrame::frameWidth();
    dVar4 = (double)(((this->d).d)->margin * 2);
    iVar3 = (int)((double)auVar5._8_4_ +
                  (double)auVar5._0_4_ + (double)local_40.d.size + (double)(iVar1 * 2) + dVar4);
    iVar1 = (int)((double)auVar5._12_4_ + (double)auVar5._4_4_ + local_28 + (double)(iVar1 * 2) +
                 dVar4);
    QTextDocument::~QTextDocument((QTextDocument *)&local_40);
  }
  QVar2.ht = iVar1;
  QVar2.wd = iVar3;
  return QVar2;
}

Assistant:

QSize
TextLabel::minimumSizeHint() const
{
	if( text().isEmpty() )
		return QSize( 2 * frameWidth(), 2 * frameWidth() );

	const QMargins margins = contentsMargins();

	QTextDocument doc;
	doc.setHtml( d->staticText.text() );
	doc.setDefaultTextOption( d->staticText.textOption() );
	doc.setTextWidth( fontMetrics().averageCharWidth() * 10 );

	const QSizeF size = doc.size();
	const int frame = 2 * frameWidth();

	return QSize( size.width() + frame + margins.left() + margins.right() +
		2 * d->margin,
		size.height() + frame + margins.top() + margins.bottom() +
		2 * d->margin );
}